

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_draw_symbol(nk_command_buffer *out,nk_symbol_type type,nk_rect content,nk_color background,
                   nk_color foreground,float border_width,nk_user_font *font)

{
  undefined1 auVar1 [16];
  char *pcVar2;
  nk_heading direction;
  char *string;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  float fVar5;
  nk_rect rect;
  nk_rect r;
  nk_vec2 points [3];
  float local_68;
  float fStack_64;
  nk_text local_38;
  float local_28;
  float local_24;
  
  switch(type) {
  case NK_SYMBOL_X:
    string = "x";
    goto LAB_0011baf3;
  case NK_SYMBOL_UNDERSCORE:
  case NK_SYMBOL_PLUS:
  case NK_SYMBOL_MINUS:
    pcVar2 = "-";
    if (type == NK_SYMBOL_PLUS) {
      pcVar2 = "+";
    }
    string = "_";
    if (type != NK_SYMBOL_UNDERSCORE) {
      string = pcVar2;
    }
LAB_0011baf3:
    local_38.padding.x = 0.0;
    local_38.padding.y = 0.0;
    local_38.background = background;
    local_38.text = foreground;
    nk_widget_text(out,content,string,1,&local_38,0x12,font);
    break;
  case NK_SYMBOL_CIRCLE_SOLID:
  case NK_SYMBOL_CIRCLE_OUTLINE:
  case NK_SYMBOL_RECT_SOLID:
  case NK_SYMBOL_RECT_OUTLINE:
    local_68 = content.x;
    fStack_64 = content.y;
    if (type - NK_SYMBOL_RECT_SOLID < 2) {
      nk_fill_rect(out,content,0.0,foreground);
      auVar1._8_8_ = content._8_8_;
      auVar1._0_8_ = content._8_8_;
      if (type == NK_SYMBOL_RECT_OUTLINE) {
        rect.x = border_width + local_68;
        rect.y = border_width + fStack_64;
        fVar5 = border_width + border_width;
        auVar3._4_4_ = fVar5;
        auVar3._0_4_ = fVar5;
        auVar3._8_4_ = fVar5;
        auVar3._12_4_ = fVar5;
        auVar4 = maxps(auVar3,auVar1);
        rect.w = auVar4._0_4_ - fVar5;
        rect.h = auVar4._4_4_ - fVar5;
        nk_fill_rect(out,rect,0.0,background);
        return;
      }
    }
    else {
      nk_fill_circle(out,content,foreground);
      auVar4._8_8_ = content._8_8_;
      auVar4._0_8_ = content._8_8_;
      if (type == NK_SYMBOL_CIRCLE_OUTLINE) {
        r.x = local_68 + 1.0;
        r.y = fStack_64 + 1.0;
        auVar4 = maxps(_DAT_00122120,auVar4);
        r.w = auVar4._0_4_ + -2.0;
        r.h = auVar4._4_4_ + -2.0;
        nk_fill_circle(out,r,background);
        return;
      }
    }
    break;
  case NK_SYMBOL_TRIANGLE_UP:
  case NK_SYMBOL_TRIANGLE_DOWN:
  case NK_SYMBOL_TRIANGLE_LEFT:
  case NK_SYMBOL_TRIANGLE_RIGHT:
    if (type == NK_SYMBOL_TRIANGLE_LEFT) {
      direction = NK_LEFT;
    }
    else {
      direction = NK_RIGHT;
      if (type != NK_SYMBOL_TRIANGLE_RIGHT) {
        direction = (uint)(type != NK_SYMBOL_TRIANGLE_UP) * 2;
      }
    }
    nk_triangle_from_direction(&local_38.padding,content,0.0,0.0,direction);
    nk_fill_triangle(out,local_38.padding.x,local_38.padding.y,(float)local_38.background,
                     (float)local_38.text,local_28,local_24,foreground);
  }
  return;
}

Assistant:

NK_INTERN void
nk_draw_symbol(struct nk_command_buffer *out, enum nk_symbol_type type,
    struct nk_rect content, struct nk_color background, struct nk_color foreground,
    float border_width, const struct nk_user_font *font)
{
    switch (type) {
    case NK_SYMBOL_X:
    case NK_SYMBOL_UNDERSCORE:
    case NK_SYMBOL_PLUS:
    case NK_SYMBOL_MINUS: {
        /* single character text symbol */
        const char *X = (type == NK_SYMBOL_X) ? "x":
            (type == NK_SYMBOL_UNDERSCORE) ? "_":
            (type == NK_SYMBOL_PLUS) ? "+": "-";
        struct nk_text text;
        text.padding = nk_vec2(0,0);
        text.background = background;
        text.text = foreground;
        nk_widget_text(out, content, X, 1, &text, NK_TEXT_CENTERED, font);
    } break;
    case NK_SYMBOL_CIRCLE_SOLID:
    case NK_SYMBOL_CIRCLE_OUTLINE:
    case NK_SYMBOL_RECT_SOLID:
    case NK_SYMBOL_RECT_OUTLINE: {
        /* simple empty/filled shapes */
        if (type == NK_SYMBOL_RECT_SOLID || type == NK_SYMBOL_RECT_OUTLINE) {
            nk_fill_rect(out, content,  0, foreground);
            if (type == NK_SYMBOL_RECT_OUTLINE)
                nk_fill_rect(out, nk_shrink_rect(content, border_width), 0, background);
        } else {
            nk_fill_circle(out, content, foreground);
            if (type == NK_SYMBOL_CIRCLE_OUTLINE)
                nk_fill_circle(out, nk_shrink_rect(content, 1), background);
        }
    } break;
    case NK_SYMBOL_TRIANGLE_UP:
    case NK_SYMBOL_TRIANGLE_DOWN:
    case NK_SYMBOL_TRIANGLE_LEFT:
    case NK_SYMBOL_TRIANGLE_RIGHT: {
        enum nk_heading heading;
        struct nk_vec2 points[3];
        heading = (type == NK_SYMBOL_TRIANGLE_RIGHT) ? NK_RIGHT :
            (type == NK_SYMBOL_TRIANGLE_LEFT) ? NK_LEFT:
            (type == NK_SYMBOL_TRIANGLE_UP) ? NK_UP: NK_DOWN;
        nk_triangle_from_direction(points, content, 0, 0, heading);
        nk_fill_triangle(out, points[0].x, points[0].y, points[1].x, points[1].y,
            points[2].x, points[2].y, foreground);
    } break;
    default:
    case NK_SYMBOL_NONE:
    case NK_SYMBOL_MAX: break;
    }
}